

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall
TypeTest_TestExistingSuperType_Test::TestBody(TypeTest_TestExistingSuperType_Test *this)

{
  ulong uVar1;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar2;
  HeapType HVar3;
  AssertHelper *this_00;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  Type local_a8;
  Type A1;
  AssertHelper local_98;
  AssertHelper local_90;
  Type A2;
  Type B1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  AssertHelper local_60;
  TypeBuilder builder_3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  adStack_50 [16];
  byte local_40;
  AssertHelper local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  AssertHelper local_28;
  Type B2;
  
  local_a8.id = 0;
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_90,1);
  adStack_50[8] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  adStack_50[9] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  adStack_50[10] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  adStack_50[0xb] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  adStack_50[0xc] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  adStack_50[0xd] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  adStack_50[0xe] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  adStack_50[0xf] =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x0;
  builder_3.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  adStack_50._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  ::wasm::TypeBuilder::setOpen((ulong)&local_90,false);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_90,(Struct *)0x0);
  if (builder_3.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
       )0x0) {
    operator_delete((void *)builder_3.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                    adStack_50._8_8_ -
                    (long)builder_3.impl._M_t.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
  }
  ::wasm::TypeBuilder::build();
  local_38.data_._0_1_ = local_40 == 0;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40 != 0) {
    testing::Message::Message((Message *)&A2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&B1,(internal *)&local_38,(AssertionResult *)"result","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x601,(char *)B1.id);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&A2);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((pointer *)B1.id !=
        &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)B1.id,
                      (ulong)((long)&(built.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
    }
    if (A2.id != 0) {
      (**(code **)(*(long *)A2.id + 8))();
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_40]._M_data)
              ((anon_class_1_0_00000001 *)&B1,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&builder_3);
    this_00 = &local_90;
LAB_001eb404:
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)this_00);
    return;
  }
  pvVar2 = std::
           get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                     ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)&builder_3);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&B1,pvVar2);
  uVar1 = *(ulong *)B1.id;
  if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
    local_a8.id = uVar1 | 2;
    operator_delete((void *)B1.id,
                    (long)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - B1.id);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_40]._M_data)
              ((anon_class_1_0_00000001 *)&B1,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&builder_3);
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_90);
    local_90.data_ = (AssertHelperData *)0x0;
    ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&A2,1);
    adStack_50[8] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    adStack_50[9] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    adStack_50[10] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    adStack_50[0xb] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    adStack_50[0xc] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    adStack_50[0xd] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    adStack_50[0xe] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    adStack_50[0xf] =
         (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
    builder_3.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )0x0;
    adStack_50._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    ::wasm::TypeBuilder::setOpen((ulong)&A2,false);
    ::wasm::TypeBuilder::setHeapType((ulong)&A2,(Struct *)0x0);
    if (builder_3.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
         )0x0) {
      operator_delete((void *)builder_3.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      adStack_50._8_8_ -
                      (long)builder_3.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
    }
    ::wasm::TypeBuilder::build();
    local_38.data_._0_1_ = local_40 == 0;
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_40 != 0) {
      testing::Message::Message((Message *)&local_28);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&B1,(internal *)&local_38,(AssertionResult *)"result","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x60c,(char *)B1.id);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((pointer *)B1.id !=
          &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)B1.id,
                        (ulong)((long)&(built.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
      }
      if (local_28.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_28.data_ + 8))();
      }
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
        ::_S_vtable._M_arr[local_40]._M_data)
                ((anon_class_1_0_00000001 *)&B1,
                 (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  *)&builder_3);
      this_00 = (AssertHelper *)&A2;
      goto LAB_001eb404;
    }
    pvVar2 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)&builder_3);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&B1,pvVar2);
    uVar1 = *(ulong *)B1.id;
    if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
      local_90.data_ = (AssertHelperData *)(uVar1 | 2);
      operator_delete((void *)B1.id,
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - B1.id);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
        ::_S_vtable._M_arr[local_40]._M_data)
                ((anon_class_1_0_00000001 *)&B1,
                 (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  *)&builder_3);
      ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&A2);
      A2.id = 0;
      ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,1);
      adStack_50[8] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      adStack_50[9] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      adStack_50[10] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      adStack_50[0xb] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      adStack_50[0xc] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      adStack_50[0xd] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      adStack_50[0xe] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      adStack_50[0xf] =
           (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      builder_3.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
            )0x0;
      adStack_50._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      ::wasm::TypeBuilder::setOpen((ulong)&local_28,false);
      HVar3 = ::wasm::Type::getHeapType(&local_a8);
      ::wasm::TypeBuilder::setSubType(&local_28,0,HVar3.id,1);
      ::wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
      if (builder_3.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        operator_delete((void *)builder_3.impl._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl,
                        adStack_50._8_8_ -
                        (long)builder_3.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)
        ;
      }
      ::wasm::TypeBuilder::build();
      local_38.data_._0_1_ = local_40 == 0;
      local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_40 != 0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&B1,(internal *)&local_38,(AssertionResult *)"result","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x617,(char *)B1.id);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if ((pointer *)B1.id !=
            &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete((void *)B1.id,
                          (ulong)((long)&(built.
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
        }
        if (local_60.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
        if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_30,local_30);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
          ::_S_vtable._M_arr[local_40]._M_data)
                  ((anon_class_1_0_00000001 *)&B1,
                   (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    *)&builder_3);
        this_00 = &local_28;
        goto LAB_001eb404;
      }
      pvVar2 = std::
               get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                         ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           *)&builder_3);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&B1,pvVar2);
      uVar1 = *(ulong *)B1.id;
      if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
        A2.id = uVar1 | 2;
        operator_delete((void *)B1.id,
                        (long)built.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - B1.id);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
          ::_S_vtable._M_arr[local_40]._M_data)
                  ((anon_class_1_0_00000001 *)&B1,
                   (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    *)&builder_3);
        ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
        local_28.data_ = (AssertHelperData *)0x0;
        ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_60,1);
        adStack_50[8] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        adStack_50[9] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        adStack_50[10] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        adStack_50[0xb] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        adStack_50[0xc] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        adStack_50[0xd] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        adStack_50[0xe] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        adStack_50[0xf] =
             (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x0;
        builder_3.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
             (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
              )0x0;
        adStack_50._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        ::wasm::TypeBuilder::setOpen((ulong)&local_60,false);
        HVar3 = ::wasm::Type::getHeapType((Type *)&local_90);
        ::wasm::TypeBuilder::setSubType(&local_60,0,HVar3.id,1);
        ::wasm::TypeBuilder::setHeapType((ulong)&local_60,(Struct *)0x0);
        if (builder_3.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
            (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
             )0x0) {
          operator_delete((void *)builder_3.impl._M_t.
                                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                  _M_head_impl,
                          adStack_50._8_8_ -
                          (long)builder_3.impl._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl);
        }
        ::wasm::TypeBuilder::build();
        local_38.data_._0_1_ = local_40 == 0;
        local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_40 != 0) {
          testing::Message::Message((Message *)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&B1,(internal *)&local_38,(AssertionResult *)"result","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&A1,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x622,(char *)B1.id);
          testing::internal::AssertHelper::operator=((AssertHelper *)&A1,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A1);
          if ((pointer *)B1.id !=
              &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete((void *)B1.id,
                            (ulong)((long)&(built.
                                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
          }
          if (local_98.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_98.data_ + 8))();
          }
          if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_30,local_30);
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                               *)&builder_3);
          this_00 = &local_60;
          goto LAB_001eb404;
        }
        pvVar2 = std::
                 get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                           ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                             *)&builder_3);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&B1,pvVar2);
        uVar1 = *(ulong *)B1.id;
        if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
          local_28.data_ = (AssertHelperData *)(uVar1 | 2);
          operator_delete((void *)B1.id,
                          (long)built.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_finish - B1.id);
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
            ::_S_vtable._M_arr[local_40]._M_data)
                    ((anon_class_1_0_00000001 *)&B1,
                     (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&builder_3);
          ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_60);
          B1.id = (uintptr_t)::wasm::Type::getHeapType(&local_a8);
          local_38.data_ = (AssertHelperData *)::wasm::Type::getHeapType((Type *)&local_90);
          testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                    ((internal *)&builder_3,"A1.getHeapType()","A2.getHeapType()",(HeapType *)&B1,
                     (HeapType *)&local_38);
          if ((char)builder_3.impl._M_t.
                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
            testing::Message::Message((Message *)&B1);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                adStack_50._0_8_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)adStack_50._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x628,pcVar4);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&B1);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            if (B1.id != 0) {
              (**(code **)(*(long *)B1.id + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)adStack_50._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(adStack_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         adStack_50._0_8_);
          }
          B1.id = (uintptr_t)::wasm::Type::getHeapType(&A2);
          local_38.data_ = (AssertHelperData *)::wasm::Type::getHeapType((Type *)&local_28);
          testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                    ((internal *)&builder_3,"B1.getHeapType()","B2.getHeapType()",(HeapType *)&B1,
                     (HeapType *)&local_38);
          if ((char)builder_3.impl._M_t.
                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
            testing::Message::Message((Message *)&B1);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                adStack_50._0_8_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)adStack_50._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x629,pcVar4);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&B1);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            if (B1.id != 0) {
              (**(code **)(*(long *)B1.id + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)adStack_50._0_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            return;
          }
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(adStack_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       adStack_50._0_8_);
          return;
        }
      }
    }
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

TEST_F(TypeTest, TestExistingSuperType) {
  // Build an initial type A1
  Type A1;
  {
    TypeBuilder builder(1);
    builder[0].setOpen() = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A1 = Type(built[0], Nullable);
  }

  // Build a separate type A2 identical to A1
  Type A2;
  {
    TypeBuilder builder(1);
    builder[0].setOpen() = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A2 = Type(built[0], Nullable);
  }

  // Build a type B1 <: A1 using a new builder
  Type B1;
  {
    TypeBuilder builder(1);
    builder[0].setOpen().subTypeOf(A1.getHeapType()) = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    B1 = Type(built[0], Nullable);
  }

  // Build a type B2 <: A2 using a new builder
  Type B2;
  {
    TypeBuilder builder(1);
    builder[0].setOpen().subTypeOf(A2.getHeapType()) = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    B2 = Type(built[0], Nullable);
  }

  // Test that A1 == A2 and B1 == B2
  EXPECT_EQ(A1.getHeapType(), A2.getHeapType());
  EXPECT_EQ(B1.getHeapType(), B2.getHeapType());
}